

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkq.cpp
# Opt level: O0

void __thiscall pg::ZLKQSolver::solve(ZLKQSolver *this,bitset *SG,int vtop,int pe,int po)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint pl_00;
  uint uVar4;
  ostream *poVar5;
  void *this_00;
  size_t sVar6;
  bitset *other;
  int iVar7;
  _label_vertex _Var8;
  byte local_531;
  bool local_41a;
  byte local_3b9;
  bitset *local_3b0;
  byte local_381;
  undefined1 local_368 [28];
  int to;
  int *curedge;
  undefined1 local_338 [24];
  undefined1 local_320 [4];
  int v_7;
  Game *local_310;
  int local_308;
  _label_vertex local_300;
  Game *local_2f0;
  int local_2e8;
  _label_vertex local_2e0;
  Game *local_2d0;
  int local_2c8;
  _label_vertex local_2c0;
  Game *local_2b0;
  int local_2a8;
  _label_vertex local_2a0;
  bitset local_290;
  _label_vertex local_270;
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined1 local_230 [28];
  int v_6;
  int local_210;
  _label_vertex local_208;
  undefined1 local_1f8 [24];
  undefined1 local_1e0 [4];
  int v_5;
  undefined1 local_1d0 [24];
  int v_4;
  bool opponent_attracted_from_us;
  int local_1b0;
  _label_vertex local_1a8;
  size_t local_198;
  size_t v_3;
  undefined1 local_180 [28];
  int v_2;
  bitset H;
  bitset local_140;
  undefined1 local_120 [8];
  bitset R;
  bitset *Wo;
  bitset *Wm;
  int pl;
  int pr;
  Game *local_d8;
  int local_d0;
  _label_vertex local_c8;
  undefined1 local_b8 [28];
  int v_1;
  int local_98;
  _label_vertex local_90;
  undefined1 local_80 [24];
  int v;
  int po_local;
  int pe_local;
  int vtop_local;
  bitset *SG_local;
  ZLKQSolver *this_local;
  uintqueue *local_48;
  uint local_3c;
  uintqueue *local_38;
  uintqueue *local_30;
  uintqueue *local_28;
  uintqueue *local_20;
  uintqueue *local_18;
  uintqueue *local_10;
  
  this->iterations = this->iterations + 1;
  local_80._20_4_ = po;
  v = pe;
  po_local = vtop;
  _pe_local = SG;
  SG_local = (bitset *)this;
  if (po < 1) {
    bitset::operator|=(&this->W0,SG);
    if ((this->super_Solver).trace == 0) {
      return;
    }
    bVar1 = bitset::any(_pe_local);
    if (!bVar1) {
      return;
    }
    std::operator<<((this->super_Solver).logger,"End of precision; presumed won by player 0:");
    for (local_80._16_4_ = po_local; -1 < (int)local_80._16_4_;
        local_80._16_4_ = local_80._16_4_ + -1) {
      bitset::operator[]((bitset *)local_80,(size_t)_pe_local);
      bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_80);
      if (bVar1) {
        poVar5 = std::operator<<((this->super_Solver).logger," \x1b[38;5;38m");
        _Var8 = Solver::label_vertex(&this->super_Solver,local_80._16_4_);
        register0x00000000 = _Var8.g;
        local_98 = _Var8.v;
        local_90.g = register0x00000000;
        local_90.v = local_98;
        poVar5 = operator<<(poVar5,&local_90);
        std::operator<<(poVar5,"\x1b[m");
      }
    }
    std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
    return;
  }
  if (pe < 1) {
    bitset::operator|=(&this->W1,SG);
    if ((this->super_Solver).trace == 0) {
      return;
    }
    bVar1 = bitset::any(_pe_local);
    if (!bVar1) {
      return;
    }
    std::operator<<((this->super_Solver).logger,"End of precision; presumed won by player 1:");
    for (local_b8._20_4_ = po_local; -1 < (int)local_b8._20_4_;
        local_b8._20_4_ = local_b8._20_4_ + -1) {
      bitset::operator[]((bitset *)local_b8,(size_t)_pe_local);
      bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_b8);
      if (bVar1) {
        poVar5 = std::operator<<((this->super_Solver).logger," \x1b[38;5;38m");
        _Var8 = Solver::label_vertex(&this->super_Solver,local_b8._20_4_);
        local_d8 = _Var8.g;
        local_d0 = _Var8.v;
        local_c8.g = local_d8;
        local_c8.v = local_d0;
        poVar5 = operator<<(poVar5,&local_c8);
        std::operator<<(poVar5,"\x1b[m");
      }
    }
    std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
    return;
  }
  while( true ) {
    local_381 = 0;
    if (-1 < po_local) {
      bitset::operator[]((bitset *)&pl,(size_t)_pe_local);
      bVar1 = bitset::reference::operator_cast_to_bool((reference *)&pl);
      local_381 = bVar1 ^ 0xff;
    }
    if ((local_381 & 1) == 0) break;
    po_local = po_local + -1;
  }
  if (po_local == -1) {
    return;
  }
  uVar3 = Solver::priority(&this->super_Solver,po_local);
  pl_00 = uVar3 & 1;
  if (pl_00 == 0) {
    solve(this,_pe_local,po_local,v,(int)local_80._20_4_ / 2);
  }
  else {
    solve(this,_pe_local,po_local,v / 2,local_80._20_4_);
  }
  if (1 < (this->super_Solver).trace) {
    poVar5 = std::operator<<((this->super_Solver).logger,"in pr=");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
    poVar5 = std::operator<<(poVar5,", pe=");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,v);
    poVar5 = std::operator<<(poVar5,", po=");
    this_00 = (void *)std::ostream::operator<<(poVar5,local_80._20_4_);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  if (pl_00 == 0) {
    sVar6 = bitset::count(_pe_local);
    if (sVar6 <= (ulong)(long)((int)local_80._20_4_ / 2)) {
      return;
    }
  }
  else {
    sVar6 = bitset::count(_pe_local);
    if (sVar6 <= (ulong)(long)(v / 2)) {
      return;
    }
  }
  if (pl_00 == 0) {
    other = &this->W0;
    local_3b0 = &this->W1;
  }
  else {
    other = &this->W1;
    local_3b0 = &this->W0;
  }
  R._allocsize = (size_t)local_3b0;
  bitset::bitset((bitset *)local_120,_pe_local);
  bitset::operator&=((bitset *)local_120,other);
  while( true ) {
    local_3b9 = 0;
    if (-1 < po_local) {
      bitset::operator[](&local_140,(size_t)local_120);
      bVar1 = bitset::reference::operator_cast_to_bool((reference *)&local_140);
      local_3b9 = bVar1 ^ 0xff;
    }
    if ((local_3b9 & 1) == 0) break;
    po_local = po_local + -1;
  }
  if (po_local == -1) {
    H._allocsize._4_4_ = 1;
    goto LAB_001ca8f8;
  }
  sVar6 = Solver::nodecount(&this->super_Solver);
  bitset::bitset((bitset *)(local_180 + 0x18),sVar6);
  local_180._20_4_ = po_local;
  while ((local_180._20_4_ != 0xffffffff &&
         (uVar4 = Solver::priority(&this->super_Solver,local_180._20_4_), (uVar4 & 1) == pl_00))) {
    bitset::operator[]((bitset *)local_180,(size_t)local_120);
    bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_180);
    if (bVar1) {
      bitset::operator[]((bitset *)&v_3,(size_t)(local_180 + 0x18));
      bitset::reference::operator=((reference *)&v_3,true);
      this->str[(int)local_180._20_4_] = -1;
      local_38 = &this->Q;
      local_3c = local_180._20_4_;
      iVar7 = (this->Q).pointer;
      (this->Q).pointer = iVar7 + 1;
      local_38->queue[iVar7] = local_180._20_4_;
      while (local_20 = &this->Q, (this->Q).pointer != 0) {
        local_10 = &this->Q;
        iVar7 = (this->Q).pointer + -1;
        (this->Q).pointer = iVar7;
        attractVertices(this,pl_00,local_10->queue[iVar7],(bitset *)(local_180 + 0x18),
                        (bitset *)local_120,(bitset *)local_120);
      }
    }
    local_180._20_4_ = local_180._20_4_ - 1;
  }
  if ((this->super_Solver).trace != 0) {
    poVar5 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mregion \x1b[36m");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
    std::operator<<(poVar5,"\x1b[m");
    for (local_198 = bitset::find_last((bitset *)(local_180 + 0x18));
        local_198 != 0xffffffffffffffff;
        local_198 = bitset::find_prev((bitset *)(local_180 + 0x18),local_198)) {
      poVar5 = std::operator<<((this->super_Solver).logger," \x1b[38;5;38m");
      _Var8 = Solver::label_vertex(&this->super_Solver,(int)local_198);
      _v_4 = _Var8.g;
      local_1b0 = _Var8.v;
      local_1a8.g = _v_4;
      local_1a8.v = local_1b0;
      poVar5 = operator<<(poVar5,&local_1a8);
      std::operator<<(poVar5,"\x1b[m");
    }
    std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
  }
  bitset::operator-=((bitset *)R._allocsize,(bitset *)local_120);
  bitset::operator-=(other,(bitset *)local_120);
  bitset::operator|=(other,(bitset *)(local_180 + 0x18));
  bitset::operator^=((bitset *)(local_180 + 0x18),(bitset *)local_120);
  solve(this,(bitset *)(local_180 + 0x18),po_local,v,local_80._20_4_);
  local_1d0[0x17] = 0;
  for (local_1d0._16_4_ = 0; (int)local_1d0._16_4_ <= po_local;
      local_1d0._16_4_ = local_1d0._16_4_ + 1) {
    bitset::operator[]((bitset *)local_1d0,(size_t)(local_180 + 0x18));
    bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_1d0);
    local_41a = false;
    if (bVar1) {
      bitset::operator[]((bitset *)local_1e0,R._allocsize);
      local_41a = bitset::reference::operator_cast_to_bool((reference *)local_1e0);
    }
    if (local_41a != false) {
      local_48 = &this->Q;
      this_local._4_4_ = local_1d0._16_4_;
      iVar7 = (this->Q).pointer;
      (this->Q).pointer = iVar7 + 1;
      local_48->queue[iVar7] = local_1d0._16_4_;
    }
  }
  local_28 = &this->Q;
  if ((this->Q).pointer != 0) {
    while (local_30 = &this->Q, (this->Q).pointer != 0) {
      local_18 = &this->Q;
      iVar7 = (this->Q).pointer + -1;
      (this->Q).pointer = iVar7;
      local_1f8._20_4_ = local_18->queue[iVar7];
      bitset::operator[]((bitset *)local_1f8,(size_t)other);
      bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_1f8);
      if (bVar1) {
        if (((this->super_Solver).trace != 0) &&
           (uVar4 = Solver::priority(&this->super_Solver,local_1f8._20_4_), uVar4 == uVar3)) {
          poVar5 = std::operator<<((this->super_Solver).logger,"\x1b[1;37mfound distraction\x1b[m: "
                                  );
          _Var8 = Solver::label_vertex(&this->super_Solver,local_1f8._20_4_);
          register0x00000000 = _Var8.g;
          local_210 = _Var8.v;
          local_208.g = register0x00000000;
          local_208.v = local_210;
          poVar5 = operator<<(poVar5,&local_208);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        local_1d0[0x17] = 1;
      }
      attractVertices(this,1 - pl_00,local_1f8._20_4_,(bitset *)R._allocsize,(bitset *)local_120,
                      (bitset *)local_120);
    }
  }
  if (1 < (this->super_Solver).trace) {
    poVar5 = std::operator<<((this->super_Solver).logger,"Subgame of (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
    poVar5 = std::operator<<(poVar5," pe=");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,v);
    poVar5 = std::operator<<(poVar5," po=");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_80._20_4_);
    std::operator<<(poVar5,"):");
    for (local_230._20_4_ = po_local; -1 < (int)local_230._20_4_;
        local_230._20_4_ = local_230._20_4_ + -1) {
      bitset::operator[]((bitset *)local_230,(size_t)_pe_local);
      bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_230);
      if (bVar1) {
        bitset::operator[]((bitset *)local_240,(size_t)local_120);
        bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_240);
        if (bVar1) {
          bitset::operator[]((bitset *)local_250,(size_t)other);
          bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_250);
          if (bVar1) {
            bitset::operator[]((bitset *)local_260,R._allocsize);
            bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_260);
            if (bVar1) {
              poVar5 = std::operator<<((this->super_Solver).logger," \x1b[38;5;202m");
              _Var8 = Solver::label_vertex(&this->super_Solver,local_230._20_4_);
              local_290._bitssize = (size_t)_Var8.g;
              local_290._allocsize._0_4_ = _Var8.v;
              local_270.g = (Game *)local_290._bitssize;
              local_270.v = (int)local_290._allocsize;
              poVar5 = operator<<(poVar5,&local_270);
              std::operator<<(poVar5,"\x1b[m");
            }
            else {
              bitset::operator[](&local_290,(size_t)(local_180 + 0x18));
              bVar1 = bitset::reference::operator_cast_to_bool((reference *)&local_290);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                poVar5 = std::operator<<((this->super_Solver).logger," \x1b[38;5;38m");
                _Var8 = Solver::label_vertex(&this->super_Solver,local_230._20_4_);
                local_2d0 = _Var8.g;
                local_2c8 = _Var8.v;
                local_2c0.g = local_2d0;
                local_2c0.v = local_2c8;
                poVar5 = operator<<(poVar5,&local_2c0);
                std::operator<<(poVar5,"\x1b[m");
              }
              else {
                poVar5 = std::operator<<((this->super_Solver).logger," \x1b[1;38;5;46m");
                _Var8 = Solver::label_vertex(&this->super_Solver,local_230._20_4_);
                local_2b0 = _Var8.g;
                local_2a8 = _Var8.v;
                local_2a0.g = local_2b0;
                local_2a0.v = local_2a8;
                poVar5 = operator<<(poVar5,&local_2a0);
                std::operator<<(poVar5,"\x1b[m");
              }
            }
          }
          else {
            poVar5 = std::operator<<((this->super_Solver).logger," \x1b[1;38;5;196m");
            _Var8 = Solver::label_vertex(&this->super_Solver,local_230._20_4_);
            local_2f0 = _Var8.g;
            local_2e8 = _Var8.v;
            local_2e0.g = local_2f0;
            local_2e0.v = local_2e8;
            poVar5 = operator<<(poVar5,&local_2e0);
            std::operator<<(poVar5,"\x1b[m");
          }
        }
        else {
          poVar5 = std::operator<<((this->super_Solver).logger," \x1b[38;5;160m");
          _Var8 = Solver::label_vertex(&this->super_Solver,local_230._20_4_);
          local_310 = _Var8.g;
          local_308 = _Var8.v;
          local_300.g = local_310;
          local_300.v = local_308;
          poVar5 = operator<<(poVar5,&local_300);
          std::operator<<(poVar5,"\x1b[m");
        }
      }
    }
    std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
  }
  if ((local_1d0[0x17] & 1) == 0) {
    for (local_338._20_4_ = po_local; -1 < (int)local_338._20_4_;
        local_338._20_4_ = local_338._20_4_ + -1) {
      bitset::operator[]((bitset *)local_338,(size_t)local_120);
      bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_338);
      bVar1 = false;
      if (bVar2) {
        bitset::operator[]((bitset *)&curedge,(size_t)other);
        bVar2 = bitset::reference::operator_cast_to_bool((reference *)&curedge);
        bVar1 = false;
        if (bVar2) {
          uVar3 = Solver::owner(&this->super_Solver,local_338._20_4_);
          bVar1 = false;
          if (uVar3 == pl_00) {
            bVar1 = this->str[(int)local_338._20_4_] == -1;
          }
        }
      }
      if (bVar1) {
        register0x00000000 = Solver::outs(&this->super_Solver,local_338._20_4_);
        local_368._20_4_ = *register0x00000000;
        while (local_368._20_4_ != -1) {
          bitset::operator[]((bitset *)local_368,(size_t)other);
          bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_368);
          if (bVar1) {
            this->str[(int)local_338._20_4_] = local_368._20_4_;
            break;
          }
          local_368._20_4_ = stack0xfffffffffffffcb0[1];
          unique0x10001233 = stack0xfffffffffffffcb0 + 1;
        }
      }
    }
LAB_001ca8e2:
    H._allocsize._4_4_ = 0;
  }
  else {
    bitset::operator-=(other,(bitset *)local_120);
    bitset::operator-=((bitset *)local_120,(bitset *)R._allocsize);
    while( true ) {
      local_531 = 0;
      if (-1 < po_local) {
        bitset::operator[]((bitset *)local_320,(size_t)local_120);
        bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_320);
        local_531 = bVar1 ^ 0xff;
      }
      if ((local_531 & 1) == 0) break;
      po_local = po_local + -1;
    }
    if (po_local != -1) {
      if (pl_00 == 0) {
        solve(this,(bitset *)local_120,po_local,v,(int)local_80._20_4_ / 2);
      }
      else {
        solve(this,(bitset *)local_120,po_local,v / 2,local_80._20_4_);
      }
      goto LAB_001ca8e2;
    }
    H._allocsize._4_4_ = 1;
  }
  bitset::~bitset((bitset *)(local_180 + 0x18));
LAB_001ca8f8:
  bitset::~bitset((bitset *)local_120);
  return;
}

Assistant:

void
ZLKQSolver::solve(bitset &SG, int vtop, const int pe, const int po)
{
    /**
     * This is based on a universal tree of height pr/2, with parameter n associated with pe or po
     * We use several implementation tricks to make optimal use of memory and allocate as few as possible
     * For example, we record partial winning sets for Even and Odd in W0 and W1, because all partial
     * winning sets between calls are disjoint (so, safe to share the same bit array)
     */

    /**
     * Record the number of recursive calls (visits)
     */

    iterations++;

    /**
     * Check if we have run out of precision / nodes! (parameter n)
     * If our opponent's precision is gone, assume it's all won by us.
     * If our own precision is gone, assume it's all won by the opponent.
     */

    if (po <= 0) {
        W0 |= SG;

#ifndef NDEBUG
        if (trace and SG.any()) {
            logger << "End of precision; presumed won by player 0:";
            for (int v=vtop; v>=0; v--) {
                if (SG[v]) {
                    logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
                }
            }
            logger << std::endl;
        }
#endif

        return;
    }

    if (pe <= 0) {
        W1 |= SG;

#ifndef NDEBUG
        if (trace and SG.any()) {
            logger << "End of precision; presumed won by player 1:";
            for (int v=vtop; v>=0; v--) {
                if (SG[v]) {
                    logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
                }
            }
            logger << std::endl;
        }
#endif

        return;
    }

    /**
     * Move <vtop> to the true top (highest vertex that is in SG)
     */

    while (vtop >= 0 and !SG[vtop]) vtop--;

    /**
     * Check if the game is empty
     */
    if (vtop == -1) return; // empty game, bye

    /**
     * Optimization: set pr/pl to top priority/player
     * This is like taking a shortcut in the Tree
     */

    const int pr = priority(vtop);
    const int pl = pr&1;

    /**
     * Expand the left side of the current level of the universal tree
     */

    if (pl == 0) {
        solve(SG, vtop, pe, po/2);
    } else {
        solve(SG, vtop, pe/2, po);
    }

#ifndef NDEBUG
    if (trace >= 2) logger << "in pr=" << pr << ", pe=" << pe << ", po=" << po << std::endl;
#endif

    /**
     * If the remaining subgame size <= po/2 cq pe/2 then we don't need to continue after the recursion.
     *   (this optimization is due to Lehtinen, Parys, Schewe, Wojtczak '21)
     */

    if (pl == 0) {
        if (SG.count() <= (unsigned long)(po/2)) return;
    } else {
        if (SG.count() <= (unsigned long)(pe/2)) return;
    }

    auto &Wm = pl == 0 ? W0 : W1; // my W
    auto &Wo = pl == 0 ? W1 : W0; // opponent's W

    /**
     * Now compute <R> := vertices in subgame that we won in the left side
     * That is, the intersection of SG and Wm.
     *
     * Consider R to be the game that remains after the steps on the left in the universal tree.
     * Fmore, SG is immutable, R is a local bitset
     */

    bitset R(SG);
    R &= Wm;

    /**
     * Update vtop to the highest vertex in the intersection
     */
    while (vtop >= 0 and !R[vtop]) vtop--;
    if (vtop == -1) return;

    /**
     * Compute H := Attr(vertices of <pr> in <R>)
     */
    bitset H(nodecount());

    for (int v=vtop; v!=-1; v--) {
        // if (priority(v) != pr) break; // stop attracting ... ;) [todo: add otf compression ?]
        if ((priority(v)&1) != pl) break; // on-the-fly compression
        if (R[v]) {
            H[v] = true;
            str[v] = -1;
            Q.push(v);
            while (Q.nonempty()) {
                attractVertices(pl, Q.pop(), H, R, R);
            }
        }
    }

#ifndef NDEBUG
    if (trace) {
        logger << "\033[1;33mregion \033[36m" << pr << "\033[m";
        for (auto v = H.find_last(); v != bitset::npos; v = H.find_prev(v)) {
            logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
        }
        logger << std::endl;
    }
#endif

    /**
     * Reset Wo and Wm for vertices in <R> - <H>;
     * Set H to the remaining subgame (G' in the universal paper)
     */

    // reset opponent and our region
    Wo -= R;
    Wm -= R;
    // but set everything in H to ours
    Wm |= H;
    // and set H := R - H
    H ^= R;

    /**
     * Go recursive!
     */
    solve(H, vtop, pe, po);

    /**
     * Let the opponent attract from our region...
     * The intersection of H and Wo is the opponent's subgame
     */
    bool opponent_attracted_from_us = false;
    for (int v=0; v<=vtop; v++) {
        if (H[v] and Wo[v]) Q.push(v);
    }
    if (Q.nonempty()) {
        while (Q.nonempty()) {
            const int v = Q.pop();
            if (Wm[v]) {
#ifndef NDEBUG
                if (trace and priority(v) == pr) {
                    logger << "\033[1;37mfound distraction\033[m: " << label_vertex(v) << std::endl;
                }
#endif
                opponent_attracted_from_us = true;
            }
            attractVertices(1-pl, v, Wo, R, R);
        }
    }

#ifndef NDEBUG
    /**
     * If so desired, report our current status...
     */
    if (trace >= 2) {
        logger << "Subgame of (" << pr << " pe=" << pe << " po=" << po << "):";
        for (int v=vtop; v>=0; v--) {
            if (SG[v]) {
                if (R[v]) {
                    if (Wm[v]) {
                        if (Wo[v]) logger << " \033[38;5;202m" << label_vertex(v) << "\033[m";
                        else if (!H[v]) logger << " \033[1;38;5;46m" << label_vertex(v) << "\033[m";
                        else logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
                    }
                    else logger << " \033[1;38;5;196m" << label_vertex(v) << "\033[m";
                }
                else logger << " \033[38;5;160m" << label_vertex(v) << "\033[m";
            }
        }
        logger << std::endl;
    }
#endif

    /**
     * Finally, if the opponent attracted from us, then we do the right side
     * of the universal tree. Otherwise: update strategies and return.
     * Notice this is also an optimization.
     */
    if (opponent_attracted_from_us) {
        // Reset my winning region <Wm>
        Wm -= R;

        // Reduce subgame by removing opponent's winning region <Wo>
        R -= Wo;

        // Update vtop
        while (vtop >= 0 and !R[vtop]) vtop--;

        // Check if the game is empty
        if (vtop == -1) return; // empty game, bye

        // Expand the right side of the current level of the universal tree
        if (pl == 0) solve(R, vtop, pe, po/2);
        else solve(R, vtop, pe/2, po);
    } else {
        // Set strategy for vertices that do not yet have a strategy
        for (int v=vtop; v>=0; v--) {
            if (R[v] and Wm[v] and owner(v) == pl and str[v] == -1) {
                auto curedge = outs(v);
                for (int to = *curedge; to != -1; to = *++curedge) {
                    if (Wm[to]) {
                        str[v] = to;
                        break;
                    }
                }
            }
        }
    }
}